

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O2

Bmcg_Man_t * Bmcg_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Bmcg_Man_t *pBVar1;
  Gia_Man_t *p;
  bmcg_sat_solver *s;
  long lVar2;
  int Lit;
  
  pBVar1 = (Bmcg_Man_t *)calloc(1,0x3a8);
  Lit = 1;
  if (0 < pGia->nRegs) {
    pBVar1->pPars = pPars;
    pBVar1->pGia = pGia;
    p = Gia_ManStart(pGia->nObjs * 3);
    pBVar1->pFrames = p;
    Gia_ManHashStart(p);
    Vec_PtrGrow(&pBVar1->vGia2Fr,1000);
    Vec_IntGrow(&pBVar1->vFr2Sat,pGia->vCis->nSize * 3);
    Vec_IntPush(&pBVar1->vFr2Sat,0);
    Vec_IntGrow(&pBVar1->vCiMap,pGia->vCis->nSize * 3);
    for (lVar2 = 0; lVar2 < pBVar1->pPars->nProcs; lVar2 = lVar2 + 1) {
      s = bmcg_sat_solver_start();
      pBVar1->pSats[lVar2] = s;
      bmcg_sat_solver_addvar(s);
      bmcg_sat_solver_addclause(pBVar1->pSats[lVar2],&Lit,1);
      bmcg_sat_solver_set_stop(pBVar1->pSats[lVar2],&pBVar1->fStopNow);
    }
    pBVar1->nSatVars = 1;
    return pBVar1;
  }
  __assert_fail("Gia_ManRegNum(pGia) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                ,0x4d,"Bmcg_Man_t *Bmcg_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
}

Assistant:

Bmcg_Man_t * Bmcg_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcg_Man_t * p = ABC_CALLOC( Bmcg_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
//    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < p->pPars->nProcs; i++ )
    {
        p->pSats[i] = bmcg_sat_solver_start();  
//        p->pSats[i]->SolverType = i;
        bmcg_sat_solver_addvar( p->pSats[i] );
        bmcg_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmcg_sat_solver_set_stop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}